

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_4::anon_unknown_0::checkCoreFile(exr_context_t f,bool reduceMemory,bool reduceTime)

{
  bool bVar1;
  int iVar2;
  byte in_DL;
  byte in_SIL;
  undefined8 in_RDI;
  exr_storage_t store;
  int p;
  int numparts;
  exr_result_t rv;
  undefined1 in_stack_000002c2;
  undefined1 in_stack_000002c3;
  int in_stack_000002c4;
  exr_context_t in_stack_000002c8;
  undefined1 in_stack_000002f2;
  undefined1 in_stack_000002f3;
  int in_stack_000002f4;
  exr_context_t in_stack_000002f8;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  byte local_12;
  byte local_11;
  undefined8 local_10;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_10 = in_RDI;
  iVar2 = exr_get_count(in_RDI,&local_1c);
  if (iVar2 == 0) {
    local_18 = 0;
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      local_18 = exr_get_storage(local_10,local_20,&local_24);
      if (local_18 != 0) {
        return true;
      }
      if ((local_24 == 0) || (local_24 == 2)) {
        bVar1 = readCoreScanlinePart
                          (in_stack_000002c8,in_stack_000002c4,(bool)in_stack_000002c3,
                           (bool)in_stack_000002c2);
        if (bVar1) {
          return true;
        }
      }
      else if (((local_24 == 1) || (local_24 == 3)) &&
              (bVar1 = readCoreTiledPart(in_stack_000002f8,in_stack_000002f4,(bool)in_stack_000002f3
                                         ,(bool)in_stack_000002f2), bVar1)) {
        return true;
      }
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
checkCoreFile (exr_context_t f, bool reduceMemory, bool reduceTime)
{
    exr_result_t rv;
    int          numparts;

    rv = exr_get_count (f, &numparts);
    if (rv != EXR_ERR_SUCCESS) return true;

    for (int p = 0; p < numparts; ++p)
    {
        exr_storage_t store;
        rv = exr_get_storage (f, p, &store);
        if (rv != EXR_ERR_SUCCESS) return true;

        if (store == EXR_STORAGE_SCANLINE || store == EXR_STORAGE_DEEP_SCANLINE)
        {
            if (readCoreScanlinePart (f, p, reduceMemory, reduceTime))
                return true;
        }
        else if (store == EXR_STORAGE_TILED || store == EXR_STORAGE_DEEP_TILED)
        {
            if (readCoreTiledPart (f, p, reduceMemory, reduceTime)) return true;
        }
    }

    return false;
}